

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_scalar_function_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::CreateScalarFunctionInfo::GetAlterInfo(CreateScalarFunctionInfo *this)

{
  pointer *__ptr;
  long *in_RSI;
  _Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false> local_e8;
  _Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false> local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  AlterEntryData local_78;
  
  ::std::__cxx11::string::string((string *)&local_98,(string *)(in_RSI + 2));
  ::std::__cxx11::string::string((string *)&local_b8,(string *)(in_RSI + 6));
  ::std::__cxx11::string::string((string *)&local_d8,(string *)(in_RSI + 0x25));
  AlterEntryData::AlterEntryData(&local_78,&local_98,&local_b8,&local_d8,RETURN_NULL);
  (**(code **)(*in_RSI + 0x18))(&local_e8);
  local_e0._M_head_impl = local_e8._M_head_impl;
  local_e8._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  make_uniq_base<duckdb::AlterInfo,duckdb::AddScalarFunctionOverloadInfo,duckdb::AlterEntryData,duckdb::unique_ptr<duckdb::CreateScalarFunctionInfo,std::default_delete<duckdb::CreateScalarFunctionInfo>,true>>
            ((duckdb *)this,&local_78,
             (unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
              *)&local_e0);
  if (local_e0._M_head_impl != (CreateScalarFunctionInfo *)0x0) {
    (*((local_e0._M_head_impl)->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo.
      _vptr_ParseInfo[1])();
  }
  local_e0._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  if (local_e8._M_head_impl != (CreateScalarFunctionInfo *)0x0) {
    (*((local_e8._M_head_impl)->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo.
      _vptr_ParseInfo[1])();
  }
  local_e8._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  AlterEntryData::~AlterEntryData(&local_78);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_98);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> CreateScalarFunctionInfo::GetAlterInfo() const {
	return make_uniq_base<AlterInfo, AddScalarFunctionOverloadInfo>(
	    AlterEntryData(catalog, schema, name, OnEntryNotFound::RETURN_NULL),
	    unique_ptr_cast<CreateInfo, CreateScalarFunctionInfo>(Copy()));
}